

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void google::protobuf::protobuf_google_2fprotobuf_2fdescriptor_2eproto::anon_unknown_5::
     protobuf_AssignDescriptors(void)

{
  string local_30;
  
  protobuf_google_2fprotobuf_2fdescriptor_2eproto::AddDescriptors();
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"google/protobuf/descriptor.proto","");
  internal::AssignDescriptors
            (&local_30,(MigrationSchema *)schemas,(Message **)file_default_instances,
             (uint32 *)protobuf_google_2fprotobuf_2fdescriptor_2eproto::TableStruct::offsets,
             (MessageFactory *)0x0,(Metadata *)&(anonymous_namespace)::file_level_metadata,
             (EnumDescriptor **)&(anonymous_namespace)::file_level_enum_descriptors,
             (ServiceDescriptor **)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void protobuf_AssignDescriptors() {
  AddDescriptors();
  ::google::protobuf::MessageFactory* factory = NULL;
  AssignDescriptors(
      "google/protobuf/descriptor.proto", schemas, file_default_instances, TableStruct::offsets, factory,
      file_level_metadata, file_level_enum_descriptors, NULL);
}